

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

HeapprofdConfig * __thiscall
perfetto::protos::gen::HeapprofdConfig::operator=(HeapprofdConfig *this,HeapprofdConfig *param_1)

{
  bool bVar1;
  undefined2 uVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  undefined3 uVar5;
  bool bVar6;
  bool bVar7;
  HeapprofdConfig *param_1_local;
  HeapprofdConfig *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  this->sampling_interval_bytes_ = param_1->sampling_interval_bytes_;
  this->adaptive_sampling_shmem_threshold_ = param_1->adaptive_sampling_shmem_threshold_;
  this->adaptive_sampling_max_sampling_interval_bytes_ =
       param_1->adaptive_sampling_max_sampling_interval_bytes_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->process_cmdline_,&param_1->process_cmdline_);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(&this->pid_,&param_1->pid_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->target_installed_by_,&param_1->target_installed_by_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->heaps_,&param_1->heaps_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->exclude_heaps_,&param_1->exclude_heaps_);
  this->stream_allocations_ = (bool)(param_1->stream_allocations_ & 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->heap_sampling_intervals_,&param_1->heap_sampling_intervals_);
  bVar1 = param_1->all_;
  uVar2 = *(undefined2 *)&param_1->field_0xba;
  uVar3 = param_1->min_anonymous_memory_kb_;
  this->all_heaps_ = param_1->all_heaps_;
  this->all_ = bVar1;
  *(undefined2 *)&this->field_0xba = uVar2;
  this->min_anonymous_memory_kb_ = uVar3;
  uVar4 = *(undefined4 *)&param_1->field_0xc4;
  this->max_heapprofd_memory_kb_ = param_1->max_heapprofd_memory_kb_;
  *(undefined4 *)&this->field_0xc4 = uVar4;
  this->max_heapprofd_cpu_secs_ = param_1->max_heapprofd_cpu_secs_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->skip_symbol_prefix_,&param_1->skip_symbol_prefix_);
  protozero::CopyablePtr<perfetto::protos::gen::HeapprofdConfig_ContinuousDumpConfig>::operator=
            (&this->continuous_dump_config_,&param_1->continuous_dump_config_);
  this->shmem_size_bytes_ = param_1->shmem_size_bytes_;
  uVar5 = *(undefined3 *)&param_1->field_0xf9;
  uVar3 = param_1->block_client_timeout_us_;
  this->block_client_ = param_1->block_client_;
  *(undefined3 *)&this->field_0xf9 = uVar5;
  this->block_client_timeout_us_ = uVar3;
  bVar1 = param_1->no_running_;
  bVar6 = param_1->dump_at_max_;
  bVar7 = param_1->disable_fork_teardown_;
  this->no_startup_ = param_1->no_startup_;
  this->no_running_ = bVar1;
  this->dump_at_max_ = bVar6;
  this->disable_fork_teardown_ = bVar7;
  this->disable_vfork_detection_ = param_1->disable_vfork_detection_;
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool HeapprofdConfig::operator==(const HeapprofdConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && sampling_interval_bytes_ == other.sampling_interval_bytes_
   && adaptive_sampling_shmem_threshold_ == other.adaptive_sampling_shmem_threshold_
   && adaptive_sampling_max_sampling_interval_bytes_ == other.adaptive_sampling_max_sampling_interval_bytes_
   && process_cmdline_ == other.process_cmdline_
   && pid_ == other.pid_
   && target_installed_by_ == other.target_installed_by_
   && heaps_ == other.heaps_
   && exclude_heaps_ == other.exclude_heaps_
   && stream_allocations_ == other.stream_allocations_
   && heap_sampling_intervals_ == other.heap_sampling_intervals_
   && all_heaps_ == other.all_heaps_
   && all_ == other.all_
   && min_anonymous_memory_kb_ == other.min_anonymous_memory_kb_
   && max_heapprofd_memory_kb_ == other.max_heapprofd_memory_kb_
   && max_heapprofd_cpu_secs_ == other.max_heapprofd_cpu_secs_
   && skip_symbol_prefix_ == other.skip_symbol_prefix_
   && continuous_dump_config_ == other.continuous_dump_config_
   && shmem_size_bytes_ == other.shmem_size_bytes_
   && block_client_ == other.block_client_
   && block_client_timeout_us_ == other.block_client_timeout_us_
   && no_startup_ == other.no_startup_
   && no_running_ == other.no_running_
   && dump_at_max_ == other.dump_at_max_
   && disable_fork_teardown_ == other.disable_fork_teardown_
   && disable_vfork_detection_ == other.disable_vfork_detection_;
}